

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

int64_t __thiscall duckdb::timestamp_t::operator-(timestamp_t *this,timestamp_t *other)

{
  bool bVar1;
  OutOfRangeException *this_00;
  allocator local_41;
  int64_t result;
  string local_38;
  
  bVar1 = TrySubtractOperator::Operation<long,long,long>(this->value,other->value,&result);
  if (bVar1) {
    return result;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Overflow in timestamp subtraction",&local_41);
  OutOfRangeException::OutOfRangeException(this_00,&local_38);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t timestamp_t::operator-(const timestamp_t &other) const {
	int64_t result;
	if (!TrySubtractOperator::Operation(value, int64_t(other.value), result)) {
		throw OutOfRangeException("Overflow in timestamp subtraction");
	}
	return result;
}